

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_avx2.c
# Opt level: O0

void aom_filter_block1d4_v4_avx2
               (uint8_t *src_ptr,ptrdiff_t src_pitch,uint8_t *output_ptr,ptrdiff_t out_pitch,
               uint32_t output_height,int16_t *filter)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  long in_RCX;
  long in_RSI;
  uint8_t *in_RDI;
  uint in_R8D;
  undefined1 (*in_R9) [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  ptrdiff_t dst_stride;
  ptrdiff_t src_stride;
  uint i;
  __m256i firstFilters;
  __m256i resReg;
  __m256i resReglo;
  __m256i srcReg2345_3456_lo;
  __m256i srcReg45_56_lo;
  __m256i srcReg23_34_lo;
  __m256i srcReg56;
  __m256i srcReg6x;
  __m256i srcReg45;
  __m256i srcReg5x;
  __m256i srcReg34;
  __m256i srcReg4x;
  __m256i srcReg23;
  __m256i addFilterReg32;
  __m256i filtersReg32;
  __m128i filtersReg;
  undefined2 in_stack_fffffffffffff960;
  undefined2 uVar17;
  undefined4 uVar18;
  long stride;
  uint8_t *output_ptr_00;
  uint local_684;
  undefined1 local_5e0 [32];
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_550;
  undefined8 uStack_548;
  ulong local_520;
  undefined8 uStack_510;
  undefined8 uStack_508;
  uint8_t *local_460;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_270;
  undefined8 uStack_268;
  ulong uStack_1b8;
  undefined8 uStack_190;
  undefined8 uStack_188;
  
  uVar17 = 0x20;
  auVar15 = vpinsrw_avx(ZEXT216(0x20),0x20,1);
  auVar15 = vpinsrw_avx(auVar15,0x20,2);
  auVar15 = vpinsrw_avx(auVar15,0x20,3);
  auVar15 = vpinsrw_avx(auVar15,0x20,4);
  auVar15 = vpinsrw_avx(auVar15,0x20,5);
  auVar15 = vpinsrw_avx(auVar15,0x20,6);
  auVar2 = vpinsrw_avx(auVar15,0x20,7);
  auVar15 = vpinsrw_avx(ZEXT216(0x20),0x20,1);
  auVar15 = vpinsrw_avx(auVar15,0x20,2);
  auVar15 = vpinsrw_avx(auVar15,0x20,3);
  auVar15 = vpinsrw_avx(auVar15,0x20,4);
  auVar15 = vpinsrw_avx(auVar15,0x20,5);
  auVar15 = vpinsrw_avx(auVar15,0x20,6);
  auVar15 = vpinsrw_avx(auVar15,0x20,7);
  uStack_270 = auVar15._0_8_;
  uStack_268 = auVar15._8_8_;
  auVar15 = vpsraw_avx(*in_R9,ZEXT416(1));
  vpacksswb_avx(auVar15,auVar15);
  uVar18 = 0x5040302;
  auVar15 = vpinsrd_avx(ZEXT416(0x5040302),0x5040302,1);
  auVar15 = vpinsrd_avx(auVar15,0x5040302,2);
  auVar15 = vpinsrd_avx(auVar15,0x5040302,3);
  auVar1 = vpinsrd_avx(ZEXT416(0x5040302),0x5040302,1);
  auVar1 = vpinsrd_avx(auVar1,0x5040302,2);
  auVar1 = vpinsrd_avx(auVar1,0x5040302,3);
  uStack_190 = auVar1._0_8_;
  uStack_188 = auVar1._8_8_;
  auVar12._8_8_ = uStack_3f8;
  auVar12._0_8_ = local_400;
  auVar12._16_8_ = local_400;
  auVar12._24_8_ = uStack_3f8;
  auVar3._16_8_ = uStack_190;
  auVar3._0_16_ = auVar15;
  auVar3._24_8_ = uStack_188;
  auVar3 = vpshufb_avx2(auVar12,auVar3);
  output_ptr_00 = (uint8_t *)(in_RSI * 2);
  stride = in_RCX * 2;
  auVar12 = auVar3;
  xx_loadu2_epi64(auVar3._16_8_,auVar3._8_8_);
  local_520 = *(ulong *)(in_RDI + in_RSI * 4);
  uStack_510 = auVar15._0_8_;
  uStack_508 = auVar15._8_8_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_520;
  auVar4._16_8_ = uStack_510;
  auVar4._24_8_ = uStack_508;
  auVar4 = vperm2i128_avx2(auVar12,auVar4,0x21);
  auVar16 = ZEXT3264(auVar4);
  local_5e0 = vpunpcklbw_avx2(auVar12,auVar4);
  local_460 = in_RDI;
  for (local_684 = in_R8D; 1 < local_684; local_684 = local_684 - 2) {
    uStack_550 = auVar16._0_8_;
    uStack_548 = auVar16._8_8_;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_520;
    auVar6._16_8_ = uStack_510;
    auVar6._0_16_ = auVar1;
    auVar6._24_8_ = uStack_508;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(ulong *)(local_460 + in_RSI * 5);
    auVar13 = ZEXT116(0) * auVar6._16_16_ + ZEXT116(1) * auVar9;
    local_520 = *(ulong *)(local_460 + in_RSI * 6);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *(ulong *)(local_460 + in_RSI * 5);
    auVar5._16_8_ = uStack_550;
    auVar5._0_16_ = auVar15;
    auVar5._24_8_ = uStack_548;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_520;
    auVar14 = ZEXT116(0) * auVar5._16_16_ + ZEXT116(1) * auVar8;
    uStack_570 = auVar13._0_8_;
    uStack_568 = auVar13._8_8_;
    uStack_5b0 = auVar14._0_8_;
    uStack_5a8 = auVar14._8_8_;
    auVar11._16_8_ = uStack_570;
    auVar11._0_16_ = ZEXT116(0) * auVar9 + ZEXT116(1) * auVar1;
    auVar11._24_8_ = uStack_568;
    auVar10._16_8_ = uStack_5b0;
    auVar10._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar15;
    auVar10._24_8_ = uStack_5a8;
    auVar12 = vpunpcklbw_avx2(auVar11,auVar10);
    auVar4 = vpunpcklwd_avx2(local_5e0,auVar12);
    auVar4 = vpmaddubsw_avx2(auVar4,auVar3);
    uStack_1b8 = SUB328(ZEXT832(0),4);
    auVar4 = vphaddsw_avx2(auVar4,ZEXT832(uStack_1b8) << 0x40);
    auVar7._16_8_ = uStack_270;
    auVar7._0_16_ = auVar2;
    auVar7._24_8_ = uStack_268;
    auVar4 = vpaddsw_avx2(auVar4,auVar7);
    auVar4 = vpsraw_avx2(auVar4,ZEXT416(6));
    vpackuswb_avx2(auVar4,auVar4);
    local_460 = output_ptr_00 + (long)local_460;
    auVar16 = ZEXT1664(auVar4._0_16_);
    xx_storeu2_epi32(output_ptr_00,stride,
                     (__m256i *)CONCAT44(uVar18,CONCAT22(uVar17,in_stack_fffffffffffff960)));
    uStack_510 = uStack_550;
    uStack_508 = uStack_548;
    local_5e0 = auVar12;
  }
  return;
}

Assistant:

static void aom_filter_block1d4_v4_avx2(
    const uint8_t *src_ptr, ptrdiff_t src_pitch, uint8_t *output_ptr,
    ptrdiff_t out_pitch, uint32_t output_height, const int16_t *filter) {
  __m128i filtersReg;
  __m256i filtersReg32, addFilterReg32;
  __m256i srcReg23, srcReg4x, srcReg34, srcReg5x, srcReg45, srcReg6x, srcReg56;
  __m256i srcReg23_34_lo, srcReg45_56_lo;
  __m256i srcReg2345_3456_lo;
  __m256i resReglo, resReg;
  __m256i firstFilters;
  unsigned int i;
  ptrdiff_t src_stride, dst_stride;

  addFilterReg32 = _mm256_set1_epi16(32);
  filtersReg = _mm_loadu_si128((const __m128i *)filter);
  // converting the 16 bit (short) to  8 bit (byte) and have the
  // same data in both lanes of 128 bit register.
  filtersReg = _mm_srai_epi16(filtersReg, 1);
  filtersReg = _mm_packs_epi16(filtersReg, filtersReg);
  // have the same data in both lanes of a 256 bit register
  filtersReg32 = MM256_BROADCASTSI128_SI256(filtersReg);

  firstFilters =
      _mm256_shuffle_epi8(filtersReg32, _mm256_set1_epi32(0x5040302u));

  // multiple the size of the source and destination stride by two
  src_stride = src_pitch << 1;
  dst_stride = out_pitch << 1;

  srcReg23 = xx_loadu2_epi64(src_ptr + src_pitch * 3, src_ptr + src_pitch * 2);
  srcReg4x = _mm256_castsi128_si256(
      _mm_loadl_epi64((const __m128i *)(src_ptr + src_pitch * 4)));

  // have consecutive loads on the same 256 register
  srcReg34 = _mm256_permute2x128_si256(srcReg23, srcReg4x, 0x21);

  srcReg23_34_lo = _mm256_unpacklo_epi8(srcReg23, srcReg34);

  for (i = output_height; i > 1; i -= 2) {
    // load the last 2 loads of 16 bytes and have every two
    // consecutive loads in the same 256 bit register
    srcReg5x = _mm256_castsi128_si256(
        _mm_loadl_epi64((const __m128i *)(src_ptr + src_pitch * 5)));
    srcReg45 =
        _mm256_inserti128_si256(srcReg4x, _mm256_castsi256_si128(srcReg5x), 1);

    srcReg6x = _mm256_castsi128_si256(
        _mm_loadl_epi64((const __m128i *)(src_ptr + src_pitch * 6)));
    srcReg56 =
        _mm256_inserti128_si256(srcReg5x, _mm256_castsi256_si128(srcReg6x), 1);

    // merge every two consecutive registers
    srcReg45_56_lo = _mm256_unpacklo_epi8(srcReg45, srcReg56);

    srcReg2345_3456_lo = _mm256_unpacklo_epi16(srcReg23_34_lo, srcReg45_56_lo);

    // multiply 2 adjacent elements with the filter and add the result
    resReglo = _mm256_maddubs_epi16(srcReg2345_3456_lo, firstFilters);

    resReglo = _mm256_hadds_epi16(resReglo, _mm256_setzero_si256());

    // shift by 6 bit each 16 bit
    resReglo = _mm256_adds_epi16(resReglo, addFilterReg32);
    resReglo = _mm256_srai_epi16(resReglo, 6);

    // shrink to 8 bit each 16 bits, the first lane contain the first
    // convolve result and the second lane contain the second convolve
    // result
    resReg = _mm256_packus_epi16(resReglo, resReglo);

    src_ptr += src_stride;

    xx_storeu2_epi32(output_ptr, out_pitch, &resReg);

    output_ptr += dst_stride;

    // save part of the registers for next strides
    srcReg23_34_lo = srcReg45_56_lo;
    srcReg4x = srcReg6x;
  }
}